

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog.hpp
# Opt level: O0

uint64_t bitmanip::detail::approximateGuessTable<64ul>(Table<unsigned_char,_64UL> *table)

{
  int iVar1;
  ulong approxFactor;
  int iVar2;
  int cmp;
  uint64_t guessedResult;
  ulong uStack_20;
  uint b;
  uint64_t result;
  Table<unsigned_char,_64UL> *table_local;
  
  uStack_20 = 0;
  guessedResult._4_4_ = 0x21;
  while( true ) {
    iVar2 = guessedResult._4_4_ + -1;
    if (guessedResult._4_4_ == 0) {
      return 0xffffffffffffffff;
    }
    approxFactor = uStack_20 | 1L << ((byte)iVar2 & 0x3f);
    iVar1 = compareApproximationToGuessTable<64ul>(approxFactor,table);
    if (iVar1 == 0) break;
    guessedResult._4_4_ = iVar2;
    if (iVar1 == -1) {
      uStack_20 = approxFactor;
    }
  }
  return approxFactor;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t approximateGuessTable(const Table<unsigned char, SIZE> &table) noexcept
{
    std::uint64_t result = 0;
    for (unsigned b = 33; b-- != 0;) {
        std::uint64_t guessedResult = result | (std::uint64_t{1} << b);
        int cmp = compareApproximationToGuessTable(guessedResult, table);
        if (cmp == 0) {
            return guessedResult;
        }
        if (cmp == -1) {
            result = guessedResult;
        }
    }
    return NO_APPROXIMATION;
}